

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

char * xm_load_module(xm_context_t *ctx,char *moddata,size_t moddata_length,char *mempool)

{
  xm_instrument_t *pxVar1;
  xm_sample_t *pxVar2;
  size_t __n;
  ushort uVar3;
  ulong uVar4;
  xm_instrument_t *__s;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  byte bVar9;
  uint8_t uVar10;
  uint uVar11;
  ulong uVar12;
  uint8_t uVar13;
  ushort uVar14;
  uint uVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  ushort uVar19;
  xm_pattern_t *pxVar20;
  xm_instrument_t *pxVar21;
  byte bVar22;
  uint8_t *puVar23;
  ulong uVar24;
  short sVar25;
  uint uVar26;
  char cVar27;
  uint uVar28;
  ulong uVar29;
  char cVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  uint8_t *src_c;
  float fVar35;
  uint16_t *local_70;
  uint16_t *local_60;
  long local_50;
  
  if (moddata_length < 0x3d) {
    uVar8 = 0;
    uVar4 = 0;
LAB_00103652:
    uVar4 = uVar8 << 0x10 | uVar4;
LAB_00103659:
    uVar3 = 0;
LAB_0010365b:
    (ctx->module).length = uVar3;
LAB_00103660:
    uVar3 = 0;
LAB_00103662:
    (ctx->module).restart_position = uVar3;
LAB_00103667:
    uVar3 = 0;
LAB_00103669:
    (ctx->module).num_channels = uVar3;
LAB_00103677:
    uVar3 = 0;
LAB_00103679:
    (ctx->module).num_patterns = uVar3;
LAB_00103687:
    bVar9 = 0;
LAB_00103689:
    uVar7 = 0;
  }
  else {
    uVar4 = (ulong)(byte)moddata[0x3c];
    if (moddata_length == 0x3d) {
LAB_0010364f:
      uVar8 = 0;
      goto LAB_00103652;
    }
    uVar4 = (ulong)CONCAT11(moddata[0x3d],moddata[0x3c]);
    if (moddata_length < 0x3f) goto LAB_0010364f;
    uVar8 = (uint)(byte)moddata[0x3e];
    if (moddata_length == 0x3f) goto LAB_00103652;
    uVar4 = ((uint)(byte)moddata[0x3e] << 0x10 | (uint)(byte)moddata[0x3f] << 0x18) | uVar4;
    if (moddata_length < 0x41) goto LAB_00103659;
    uVar3 = (ushort)(byte)moddata[0x40];
    if (moddata_length == 0x41) goto LAB_0010365b;
    (ctx->module).length = CONCAT11(moddata[0x41],moddata[0x40]);
    if (moddata_length < 0x43) goto LAB_00103660;
    uVar3 = (ushort)(byte)moddata[0x42];
    if (moddata_length == 0x43) goto LAB_00103662;
    (ctx->module).restart_position = CONCAT11(moddata[0x43],moddata[0x42]);
    if (moddata_length < 0x45) goto LAB_00103667;
    uVar3 = (ushort)(byte)moddata[0x44];
    if (moddata_length == 0x45) goto LAB_00103669;
    (ctx->module).num_channels = CONCAT11(moddata[0x45],moddata[0x44]);
    if (moddata_length < 0x47) goto LAB_00103677;
    uVar3 = (ushort)(byte)moddata[0x46];
    if (moddata_length == 0x47) goto LAB_00103679;
    uVar3 = CONCAT11(moddata[0x47],moddata[0x46]);
    (ctx->module).num_patterns = uVar3;
    if (moddata_length < 0x49) goto LAB_00103687;
    bVar9 = moddata[0x48];
    if (moddata_length == 0x49) goto LAB_00103689;
    uVar7 = (ushort)(byte)moddata[0x49] << 8;
  }
  local_60 = &(ctx->module).num_patterns;
  local_70 = &(ctx->module).num_channels;
  (ctx->module).num_instruments = uVar7 | bVar9;
  (ctx->module).patterns = (xm_pattern_t *)mempool;
  (ctx->module).instruments = (xm_instrument_t *)(mempool + (ulong)uVar3 * 0x10);
  if (moddata_length < 0x4b) {
    (ctx->module).frequency_type = XM_AMIGA_FREQUENCIES;
LAB_0010370e:
    uVar5 = 0;
LAB_00103710:
    ctx->tempo = uVar5;
LAB_00103718:
    uVar5 = 0;
  }
  else {
    (ctx->module).frequency_type = ~(uint)(byte)moddata[0x4a] & XM_AMIGA_FREQUENCIES;
    if (moddata_length < 0x4d) goto LAB_0010370e;
    uVar5 = (ushort)(byte)moddata[0x4c];
    if (moddata_length == 0x4d) goto LAB_00103710;
    ctx->tempo = CONCAT11(moddata[0x4d],moddata[0x4c]);
    if (moddata_length == 0x4e) goto LAB_00103718;
    uVar14 = (ushort)(byte)moddata[0x4e];
    uVar5 = (ushort)(byte)moddata[0x4e];
    if (0x4f < moddata_length) {
      uVar5 = (ushort)(byte)moddata[0x4f] << 8;
      goto LAB_0010371c;
    }
  }
  uVar14 = uVar5;
  uVar5 = 0;
LAB_0010371c:
  __s = (xm_instrument_t *)(mempool + (ulong)uVar3 * 0x10) + ((uint)uVar7 | (uint)bVar9);
  ctx->bpm = uVar5 | uVar14;
  uVar33 = 0;
  if (0x4f < moddata_length) {
    uVar33 = moddata_length - 0x50;
  }
  if (0xff < uVar33) {
    uVar33 = 0x100;
  }
  memcpy((ctx->module).pattern_table,moddata + 0x50,uVar33);
  memset((ctx->module).pattern_table + uVar33,0,0x100 - uVar33);
  uVar4 = uVar4 + 0x3c;
  uVar3 = (ctx->module).num_patterns;
  if (uVar3 != 0) {
    uVar33 = 0;
    do {
      if (uVar4 + 7 < moddata_length) {
        uVar7 = (ushort)(byte)moddata[uVar4 + 7];
      }
      else {
        uVar7 = 0;
      }
      if (uVar4 + 8 < moddata_length) {
        uVar5 = (ushort)(byte)moddata[uVar4 + 8] << 8;
      }
      else {
        uVar5 = 0;
      }
      if (uVar4 + 5 < moddata_length) {
        uVar14 = (ushort)(byte)moddata[uVar4 + 5];
      }
      else {
        uVar14 = 0;
      }
      if (uVar4 + 6 < moddata_length) {
        uVar6 = (ushort)(byte)moddata[uVar4 + 6] << 8;
      }
      else {
        uVar6 = 0;
      }
      pxVar20 = (ctx->module).patterns + uVar33;
      pxVar20->num_rows = uVar14 | uVar6;
      pxVar20->slots = (xm_pattern_slot_t *)__s;
      if (uVar4 < moddata_length) {
        uVar12 = (ulong)(byte)moddata[uVar4];
      }
      else {
        uVar12 = 0;
      }
      if (uVar4 + 1 < moddata_length) {
        uVar34 = (ulong)(byte)moddata[uVar4 + 1] << 8;
      }
      else {
        uVar34 = 0;
      }
      if (uVar4 + 2 < moddata_length) {
        uVar8 = (uint)(byte)moddata[uVar4 + 2];
      }
      else {
        uVar8 = 0;
      }
      if (uVar4 + 3 < moddata_length) {
        uVar11 = (uint)(byte)moddata[uVar4 + 3] << 8;
      }
      else {
        uVar11 = 0;
      }
      __n = (ulong)(uVar14 | uVar6) * (ulong)*local_70 * 5;
      lVar32 = ((ulong)((uVar11 | uVar8) << 0x10) | uVar34 | uVar12) + uVar4;
      if ((uVar7 | uVar5) == 0) {
        memset(__s,0,__n);
        uVar3 = *local_60;
      }
      else {
        uVar14 = 0;
        uVar6 = 0;
        do {
          uVar4 = (ulong)uVar14 + lVar32;
          if (uVar4 < moddata_length) {
            bVar9 = moddata[uVar4];
            puVar23 = __s->sample_of_notes + (ulong)uVar6 * 5 + -2;
            if (-1 < (char)bVar9) goto LAB_001038d1;
            uVar19 = uVar14 + 1;
            if ((bVar9 & 1) == 0) {
              *puVar23 = 0;
            }
            else {
              if ((ulong)uVar19 + lVar32 < moddata_length) {
                bVar16 = moddata[(ulong)uVar19 + lVar32];
              }
              else {
                bVar16 = 0;
              }
              *puVar23 = bVar16;
              uVar19 = uVar14 + 2;
            }
            if ((bVar9 & 2) == 0) {
              puVar23[1] = 0;
            }
            else {
              if ((ulong)uVar19 + lVar32 < moddata_length) {
                bVar16 = moddata[(ulong)uVar19 + lVar32];
              }
              else {
                bVar16 = 0;
              }
              puVar23[1] = bVar16;
              uVar19 = uVar19 + 1;
            }
            if ((bVar9 & 4) == 0) {
              puVar23[2] = 0;
            }
            else {
              if ((ulong)uVar19 + lVar32 < moddata_length) {
                bVar16 = moddata[(ulong)uVar19 + lVar32];
              }
              else {
                bVar16 = 0;
              }
              puVar23[2] = bVar16;
              uVar19 = uVar19 + 1;
            }
            if ((bVar9 & 8) == 0) {
              puVar23[3] = 0;
              uVar14 = uVar19;
            }
            else {
              if ((ulong)uVar19 + lVar32 < moddata_length) {
                bVar16 = moddata[(ulong)uVar19 + lVar32];
              }
              else {
                bVar16 = 0;
              }
              puVar23[3] = bVar16;
              uVar14 = uVar19 + 1;
            }
            if ((bVar9 & 0x10) == 0) {
              puVar23[4] = 0;
            }
            else {
              if ((ulong)uVar14 + lVar32 < moddata_length) {
                bVar9 = moddata[(ulong)uVar14 + lVar32];
              }
              else {
                bVar9 = 0;
              }
              puVar23[4] = bVar9;
              uVar14 = uVar14 + 1;
            }
          }
          else {
            puVar23 = __s->sample_of_notes + (ulong)uVar6 * 5 + -2;
            bVar9 = 0;
LAB_001038d1:
            *puVar23 = bVar9;
            if (uVar4 + 1 < moddata_length) {
              bVar9 = moddata[uVar4 + 1];
            }
            else {
              bVar9 = 0;
            }
            puVar23[1] = bVar9;
            if (uVar4 + 2 < moddata_length) {
              bVar9 = moddata[uVar4 + 2];
            }
            else {
              bVar9 = 0;
            }
            puVar23[2] = bVar9;
            if (uVar4 + 3 < moddata_length) {
              bVar9 = moddata[uVar4 + 3];
            }
            else {
              bVar9 = 0;
            }
            puVar23[3] = bVar9;
            if (uVar4 + 4 < moddata_length) {
              bVar9 = moddata[uVar4 + 4];
            }
            else {
              bVar9 = 0;
            }
            puVar23[4] = bVar9;
            uVar14 = uVar14 + 5;
          }
          uVar6 = uVar6 + 1;
        } while (uVar14 < (uVar7 | uVar5));
      }
      __s = (xm_instrument_t *)(__s->sample_of_notes + (__n - 2));
      uVar4 = lVar32 + (ulong)(uVar7 | uVar5);
      uVar33 = uVar33 + 1;
    } while (uVar33 < uVar3);
  }
  if ((ctx->module).num_instruments != 0) {
    local_60 = (uint16_t *)0x64;
    local_50 = 0x9c;
    uVar33 = 0;
    do {
      uVar8 = 0;
      if (uVar4 < moddata_length) {
        uVar8 = (uint)(byte)moddata[uVar4];
      }
      uVar28 = 0;
      uVar11 = 0;
      if (uVar4 + 1 < moddata_length) {
        uVar11 = (uint)(byte)moddata[uVar4 + 1] << 8;
      }
      if (uVar4 + 2 < moddata_length) {
        uVar28 = (uint)(byte)moddata[uVar4 + 2];
      }
      uVar15 = 0;
      if (uVar4 + 3 < moddata_length) {
        uVar15 = (uint)(byte)moddata[uVar4 + 3] << 8;
      }
      uVar15 = (uVar15 | uVar28) * 0x10000;
      uVar28 = uVar11 | uVar8 | uVar15;
      if (((uVar11 | uVar8) + uVar15) - 0x108 < 0xfffffef9) {
        uVar28 = 0x107;
      }
      uVar12 = uVar28 + uVar4;
      if (uVar4 + 0x1b < uVar12) {
        uVar3 = (ushort)(byte)moddata[uVar4 + 0x1b];
      }
      else {
        uVar3 = 0;
      }
      if (uVar4 + 0x1c < uVar12) {
        uVar7 = (ushort)(byte)moddata[uVar4 + 0x1c] << 8;
      }
      else {
        uVar7 = 0;
      }
      pxVar1 = (ctx->module).instruments;
      pxVar21 = pxVar1 + uVar33;
      pxVar21->num_samples = uVar7 | uVar3;
      if ((uVar7 | uVar3) == 0) {
        pxVar21->samples = (xm_sample_t *)0x0;
      }
      else {
        uVar34 = 0;
        if (uVar4 + 0x21 <= uVar12) {
          uVar34 = uVar12 - (uVar4 + 0x21);
        }
        if (0x5f < uVar34) {
          uVar34 = 0x60;
        }
        memcpy(pxVar21->sample_of_notes,moddata + uVar4 + 0x21,uVar34);
        memset(pxVar21->sample_of_notes + uVar34,0,0x60 - uVar34);
        uVar8 = 0;
        if ((uVar4 + 0xe1 < uVar12) &&
           (uVar8 = (uint)(byte)moddata[uVar4 + 0xe1], 0xb < (byte)moddata[uVar4 + 0xe1])) {
          uVar8 = 0xc;
        }
        uVar10 = (uint8_t)uVar8;
        (pxVar21->volume_envelope).num_points = uVar10;
        if (uVar4 + 0xe2 < uVar12) {
          bVar9 = moddata[uVar4 + 0xe2];
          if (0xb < bVar9) {
            bVar9 = 0xc;
          }
        }
        else {
          bVar9 = 0;
        }
        (pxVar21->panning_envelope).num_points = bVar9;
        if (uVar10 != '\0') {
          uVar34 = 0;
          do {
            if (uVar4 + uVar34 + 0x81 < uVar12) {
              uVar3 = (ushort)(byte)moddata[uVar34 + uVar4 + 0x81];
            }
            else {
              uVar3 = 0;
            }
            if (uVar4 + uVar34 + 0x82 < uVar12) {
              uVar7 = (ushort)(byte)moddata[uVar34 + uVar4 + 0x82] << 8;
            }
            else {
              uVar7 = 0;
            }
            *(ushort *)(pxVar1->sample_of_notes + uVar34 + (long)local_60 + -4) = uVar3 | uVar7;
            if (uVar4 + uVar34 + 0x83 < uVar12) {
              uVar3 = (ushort)(byte)moddata[uVar34 + uVar4 + 0x83];
            }
            else {
              uVar3 = 0;
            }
            if (uVar4 + uVar34 + 0x84 < uVar12) {
              uVar7 = (ushort)(byte)moddata[uVar34 + uVar4 + 0x84] << 8;
            }
            else {
              uVar7 = 0;
            }
            *(ushort *)(pxVar1->sample_of_notes + uVar34 + (long)local_60 + -2) = uVar3 | uVar7;
            uVar34 = uVar34 + 4;
          } while (uVar8 * 4 != uVar34);
        }
        if (bVar9 != 0) {
          uVar34 = 0;
          do {
            if (uVar4 + uVar34 + 0xb1 < uVar12) {
              uVar3 = (ushort)(byte)moddata[uVar34 + uVar4 + 0xb1];
            }
            else {
              uVar3 = 0;
            }
            if (uVar4 + uVar34 + 0xb2 < uVar12) {
              uVar7 = (ushort)(byte)moddata[uVar34 + uVar4 + 0xb2] << 8;
            }
            else {
              uVar7 = 0;
            }
            *(ushort *)(pxVar1->sample_of_notes + uVar34 + local_50 + -4) = uVar3 | uVar7;
            if (uVar4 + uVar34 + 0xb3 < uVar12) {
              uVar3 = (ushort)(byte)moddata[uVar34 + uVar4 + 0xb3];
            }
            else {
              uVar3 = 0;
            }
            if (uVar4 + uVar34 + 0xb4 < uVar12) {
              uVar7 = (ushort)(byte)moddata[uVar34 + uVar4 + 0xb4] << 8;
            }
            else {
              uVar7 = 0;
            }
            *(ushort *)(pxVar1->sample_of_notes + uVar34 + local_50 + -2) = uVar3 | uVar7;
            uVar34 = uVar34 + 4;
          } while ((uint)bVar9 * 4 != uVar34);
        }
        if (uVar4 + 0xe3 < uVar12) {
          uVar13 = moddata[uVar4 + 0xe3];
        }
        else {
          uVar13 = '\0';
        }
        (pxVar21->volume_envelope).sustain_point = uVar13;
        if (uVar4 + 0xe4 < uVar12) {
          bVar16 = moddata[uVar4 + 0xe4];
        }
        else {
          bVar16 = 0;
        }
        (pxVar21->volume_envelope).loop_start_point = bVar16;
        if (uVar4 + 0xe5 < uVar12) {
          bVar17 = moddata[uVar4 + 0xe5];
        }
        else {
          bVar17 = 0;
        }
        (pxVar21->volume_envelope).loop_end_point = bVar17;
        if (uVar4 + 0xe6 < uVar12) {
          uVar13 = moddata[uVar4 + 0xe6];
        }
        else {
          uVar13 = '\0';
        }
        (pxVar21->panning_envelope).sustain_point = uVar13;
        if (uVar4 + 0xe7 < uVar12) {
          bVar18 = moddata[uVar4 + 0xe7];
        }
        else {
          bVar18 = 0;
        }
        (pxVar21->panning_envelope).loop_start_point = bVar18;
        if (uVar4 + 0xe8 < uVar12) {
          bVar22 = moddata[uVar4 + 0xe8];
        }
        else {
          bVar22 = 0;
        }
        (pxVar21->panning_envelope).loop_end_point = bVar22;
        if (uVar10 != '\0') {
          uVar8 = uVar8 - 1;
          if (uVar8 <= bVar16) {
            bVar16 = (byte)uVar8;
          }
          (pxVar21->volume_envelope).loop_start_point = bVar16;
          bVar16 = (byte)uVar8;
          if (bVar17 < uVar8) {
            bVar16 = bVar17;
          }
          (pxVar21->volume_envelope).loop_end_point = bVar16;
        }
        if (bVar9 != 0) {
          uVar11 = bVar9 - 1;
          uVar8 = (uint)bVar18;
          if (uVar11 <= bVar18) {
            uVar8 = uVar11;
          }
          (pxVar21->panning_envelope).loop_start_point = (uint8_t)uVar8;
          bVar9 = (byte)uVar11;
          if (bVar22 < uVar11) {
            bVar9 = bVar22;
          }
          (pxVar21->panning_envelope).loop_end_point = bVar9;
        }
        if (uVar4 + 0xe9 < uVar12) {
          bVar9 = moddata[uVar4 + 0xe9];
        }
        else {
          bVar9 = 0;
        }
        (pxVar21->volume_envelope).enabled = (_Bool)(bVar9 & 1);
        (pxVar21->volume_envelope).sustain_enabled = (_Bool)(bVar9 >> 1 & 1);
        (pxVar21->volume_envelope).loop_enabled = (_Bool)(bVar9 >> 2 & 1);
        if (uVar4 + 0xea < uVar12) {
          bVar9 = moddata[uVar4 + 0xea];
        }
        else {
          bVar9 = 0;
        }
        (pxVar21->panning_envelope).enabled = (_Bool)(bVar9 & 1);
        (pxVar21->panning_envelope).sustain_enabled = (_Bool)(bVar9 >> 1 & 1);
        (pxVar21->panning_envelope).loop_enabled = (_Bool)(bVar9 >> 2 & 1);
        if (uVar4 + 0xeb < uVar12) {
          bVar9 = moddata[uVar4 + 0xeb];
          pxVar21->vibrato_type = (uint)bVar9;
          if (bVar9 == XM_RAMP_DOWN_WAVEFORM) {
            pxVar21->vibrato_type = XM_SQUARE_WAVEFORM;
          }
          else if (bVar9 == 2) {
            pxVar21->vibrato_type = XM_RAMP_DOWN_WAVEFORM;
          }
        }
        else {
          pxVar21->vibrato_type = XM_SINE_WAVEFORM;
        }
        if (uVar4 + 0xec < uVar12) {
          uVar10 = moddata[uVar4 + 0xec];
        }
        else {
          uVar10 = '\0';
        }
        pxVar21->vibrato_sweep = uVar10;
        if (uVar4 + 0xed < uVar12) {
          uVar10 = moddata[uVar4 + 0xed];
        }
        else {
          uVar10 = '\0';
        }
        pxVar21->vibrato_depth = uVar10;
        if (uVar4 + 0xee < uVar12) {
          uVar10 = moddata[uVar4 + 0xee];
        }
        else {
          uVar10 = '\0';
        }
        pxVar21->vibrato_rate = uVar10;
        if (uVar4 + 0xef < uVar12) {
          uVar3 = (ushort)(byte)moddata[uVar4 + 0xef];
        }
        else {
          uVar3 = 0;
        }
        if (uVar4 + 0xf0 < uVar12) {
          uVar7 = (ushort)(byte)moddata[uVar4 + 0xf0] << 8;
        }
        else {
          uVar7 = 0;
        }
        pxVar21->volume_fadeout = uVar3 | uVar7;
        pxVar21->samples = (xm_sample_t *)__s;
        __s = (xm_instrument_t *)(__s->sample_of_notes + (ulong)pxVar21->num_samples * 0x38 + -2);
        if ((ulong)pxVar21->num_samples != 0) {
          lVar32 = 0;
          uVar4 = 0;
          do {
            uVar34 = uVar12;
            uVar8 = 0;
            uVar11 = 0;
            if (uVar34 < moddata_length) {
              uVar11 = (uint)(byte)moddata[uVar34];
            }
            if (uVar34 + 1 < moddata_length) {
              uVar8 = (uint)(byte)moddata[uVar34 + 1] << 8;
            }
            uVar28 = 0;
            uVar15 = 0;
            if (uVar34 + 2 < moddata_length) {
              uVar15 = (uint)(byte)moddata[uVar34 + 2];
            }
            if (uVar34 + 3 < moddata_length) {
              uVar28 = (uint)(byte)moddata[uVar34 + 3] << 8;
            }
            pxVar2 = pxVar21->samples;
            uVar8 = (uVar28 | uVar15) << 0x10 | uVar8 | uVar11;
            *(uint *)((long)&pxVar2->length + lVar32) = uVar8;
            uVar11 = 0;
            uVar28 = 0;
            if (uVar34 + 4 < moddata_length) {
              uVar28 = (uint)(byte)moddata[uVar34 + 4];
            }
            if (uVar34 + 5 < moddata_length) {
              uVar11 = (uint)(byte)moddata[uVar34 + 5] << 8;
            }
            uVar15 = 0;
            uVar26 = 0;
            if (uVar34 + 6 < moddata_length) {
              uVar26 = (uint)(byte)moddata[uVar34 + 6];
            }
            if (uVar34 + 7 < moddata_length) {
              uVar15 = (uint)(byte)moddata[uVar34 + 7] << 8;
            }
            uVar11 = (uVar15 | uVar26) << 0x10 | uVar11 | uVar28;
            *(uint *)((long)&pxVar2->loop_start + lVar32) = uVar11;
            uVar28 = 0;
            uVar15 = 0;
            if (uVar34 + 8 < moddata_length) {
              uVar15 = (uint)(byte)moddata[uVar34 + 8];
            }
            if (uVar34 + 9 < moddata_length) {
              uVar28 = (uint)(byte)moddata[uVar34 + 9] << 8;
            }
            uVar26 = 0;
            uVar31 = 0;
            if (uVar34 + 10 < moddata_length) {
              uVar31 = (uint)(byte)moddata[uVar34 + 10];
            }
            if (uVar34 + 0xb < moddata_length) {
              uVar26 = (uint)(byte)moddata[uVar34 + 0xb] << 8;
            }
            uVar28 = (uVar26 | uVar31) << 0x10 | uVar28 | uVar15;
            *(uint *)((long)&pxVar2->loop_length + lVar32) = uVar28;
            uVar28 = uVar28 + uVar11;
            *(uint *)((long)&pxVar2->loop_end + lVar32) = uVar28;
            fVar35 = 0.0;
            if (uVar34 + 0xc < moddata_length) {
              fVar35 = (float)(byte)moddata[uVar34 + 0xc] * 0.015625;
            }
            *(float *)((long)&pxVar2->volume + lVar32) = fVar35;
            if (uVar34 + 0xd < moddata_length) {
              cVar30 = moddata[uVar34 + 0xd];
            }
            else {
              cVar30 = '\0';
            }
            (&pxVar2->finetune)[lVar32] = cVar30;
            if (uVar8 < uVar11) {
              *(uint *)((long)&pxVar2->loop_start + lVar32) = uVar8;
              uVar11 = uVar8;
            }
            if (uVar8 < uVar28) {
              *(uint *)((long)&pxVar2->loop_end + lVar32) = uVar8;
              uVar28 = uVar8;
            }
            *(uint *)((long)&pxVar2->loop_length + lVar32) = uVar28 - uVar11;
            uVar15 = 0;
            if (uVar34 + 0xe < moddata_length) {
              bVar9 = moddata[uVar34 + 0xe];
              uVar15 = (uint)bVar9;
              if (((bVar9 & 3) == 0) || (uVar28 == uVar11)) goto LAB_001041e7;
              if ((bVar9 & 3) == 1) {
                *(undefined4 *)((long)&pxVar2->loop_type + lVar32) = 1;
              }
              else {
                *(undefined4 *)((long)&pxVar2->loop_type + lVar32) = 2;
              }
            }
            else {
LAB_001041e7:
              *(undefined4 *)((long)&pxVar2->loop_type + lVar32) = 0;
            }
            (&pxVar2->bits)[lVar32] = (char)((uVar15 & 0x10) >> 4) * '\b' + '\b';
            fVar35 = 0.0;
            if (uVar34 + 0xf < moddata_length) {
              fVar35 = (float)(byte)moddata[uVar34 + 0xf];
            }
            *(float *)((long)&pxVar2->panning + lVar32) = fVar35 / 255.0;
            if (uVar34 + 0x10 < moddata_length) {
              cVar30 = moddata[uVar34 + 0x10];
            }
            else {
              cVar30 = '\0';
            }
            (&pxVar2->relative_note)[lVar32] = cVar30;
            *(xm_instrument_t **)((long)&pxVar2->field_11 + lVar32) = __s;
            if ((uVar15 & 0x10) != 0) {
              *(uint *)((long)&pxVar2->loop_start + lVar32) = uVar11 >> 1;
              *(uint *)((long)&pxVar2->loop_length + lVar32) = uVar28 - uVar11 >> 1;
              *(uint *)((long)&pxVar2->loop_end + lVar32) = uVar28 >> 1;
              *(uint *)((long)&pxVar2->length + lVar32) = uVar8 >> 1;
            }
            __s = (xm_instrument_t *)(__s->sample_of_notes + ((ulong)uVar8 - 2));
            uVar4 = uVar4 + 1;
            lVar32 = lVar32 + 0x38;
            uVar12 = uVar34 + 0x28;
          } while (uVar4 < pxVar21->num_samples);
          uVar12 = uVar34 + 0x28;
          if (pxVar21->num_samples != 0) {
            uVar4 = 0;
            do {
              pxVar2 = pxVar21->samples;
              uVar8 = pxVar2[uVar4].length;
              uVar34 = (ulong)uVar8;
              if (pxVar2[uVar4].bits == '\x10') {
                if (uVar34 != 0) {
                  uVar24 = 0;
                  sVar25 = 0;
                  do {
                    uVar29 = (uVar24 & 0xffffffff) + uVar12;
                    uVar3 = 0;
                    if (uVar29 < moddata_length) {
                      uVar3 = (ushort)(byte)moddata[uVar29];
                    }
                    uVar7 = 0;
                    if (uVar29 + 1 < moddata_length) {
                      uVar7 = (ushort)(byte)moddata[uVar29 + 1] << 8;
                    }
                    sVar25 = sVar25 + (uVar7 | uVar3);
                    *(short *)(pxVar2[uVar4].field_11.data8 + uVar24) = sVar25;
                    uVar24 = uVar24 + 2;
                  } while (uVar34 * 2 != uVar24);
                }
                uVar8 = uVar8 * 2;
              }
              else if (uVar34 == 0) {
                uVar8 = 0;
              }
              else {
                uVar24 = 0;
                cVar30 = '\0';
                do {
                  cVar27 = '\0';
                  if (uVar12 + uVar24 < moddata_length) {
                    cVar27 = moddata[uVar24 + uVar12];
                  }
                  cVar30 = cVar30 + cVar27;
                  pxVar2[uVar4].field_11.data8[uVar24] = cVar30;
                  uVar24 = uVar24 + 1;
                } while (uVar34 != uVar24);
                uVar8 = pxVar2[uVar4].length;
              }
              uVar12 = uVar12 + uVar8;
              uVar4 = uVar4 + 1;
            } while (uVar4 < pxVar21->num_samples);
          }
        }
      }
      uVar33 = uVar33 + 1;
      local_60 = (uint16_t *)((long)local_60 + 0xf8);
      local_50 = local_50 + 0xf8;
      uVar4 = uVar12;
    } while (uVar33 < (ctx->module).num_instruments);
  }
  return (char *)__s;
}

Assistant:

char* xm_load_module(xm_context_t* ctx, const char* moddata, size_t moddata_length, char* mempool) {
	size_t offset = 0;
	xm_module_t* mod = &(ctx->module);

	/* Read XM header */
#if XM_STRINGS
	READ_MEMCPY(mod->name, offset + 17, MODULE_NAME_LENGTH);
	READ_MEMCPY(mod->trackername, offset + 38, TRACKER_NAME_LENGTH);
#endif
	offset += 60;

	/* Read module header */
	uint32_t header_size = READ_U32(offset);

	mod->length = READ_U16(offset + 4);
	mod->restart_position = READ_U16(offset + 6);
	mod->num_channels = READ_U16(offset + 8);
	mod->num_patterns = READ_U16(offset + 10);
	mod->num_instruments = READ_U16(offset + 12);

	mod->patterns = (xm_pattern_t*)mempool;
	mempool += mod->num_patterns * sizeof(xm_pattern_t);

	mod->instruments = (xm_instrument_t*)mempool;
	mempool += mod->num_instruments * sizeof(xm_instrument_t);

	uint16_t flags = READ_U32(offset + 14);
	mod->frequency_type = (flags & (1 << 0)) ? XM_LINEAR_FREQUENCIES : XM_AMIGA_FREQUENCIES;

	ctx->tempo = READ_U16(offset + 16);
	ctx->bpm = READ_U16(offset + 18);

	READ_MEMCPY(mod->pattern_table, offset + 20, PATTERN_ORDER_TABLE_LENGTH);
	offset += header_size;

	/* Read patterns */
	for(uint16_t i = 0; i < mod->num_patterns; ++i) {
		uint16_t packed_patterndata_size = READ_U16(offset + 7);
		xm_pattern_t* pat = mod->patterns + i;

		pat->num_rows = READ_U16(offset + 5);

		pat->slots = (xm_pattern_slot_t*)mempool;
		mempool += mod->num_channels * pat->num_rows * sizeof(xm_pattern_slot_t);

		/* Pattern header length */
		offset += READ_U32(offset);

		if(packed_patterndata_size == 0) {
			/* No pattern data is present */
			memset(pat->slots, 0, sizeof(xm_pattern_slot_t) * pat->num_rows * mod->num_channels);
		} else {
			/* This isn't your typical for loop */
			for(uint16_t j = 0, k = 0; j < packed_patterndata_size; ++k) {
				uint8_t note = READ_U8(offset + j);
				xm_pattern_slot_t* slot = pat->slots + k;

				if(note & (1 << 7)) {
					/* MSB is set, this is a compressed packet */
					++j;

					if(note & (1 << 0)) {
						/* Note follows */
						slot->note = READ_U8(offset + j);
						++j;
					} else {
						slot->note = 0;
					}

					if(note & (1 << 1)) {
						/* Instrument follows */
						slot->instrument = READ_U8(offset + j);
						++j;
					} else {
						slot->instrument = 0;
					}

					if(note & (1 << 2)) {
						/* Volume column follows */
						slot->volume_column = READ_U8(offset + j);
						++j;
					} else {
						slot->volume_column = 0;
					}

					if(note & (1 << 3)) {
						/* Effect follows */
						slot->effect_type = READ_U8(offset + j);
						++j;
					} else {
						slot->effect_type = 0;
					}

					if(note & (1 << 4)) {
						/* Effect parameter follows */
						slot->effect_param = READ_U8(offset + j);
						++j;
					} else {
						slot->effect_param = 0;
					}
				} else {
					/* Uncompressed packet */
					slot->note = note;
					slot->instrument = READ_U8(offset + j + 1);
					slot->volume_column = READ_U8(offset + j + 2);
					slot->effect_type = READ_U8(offset + j + 3);
					slot->effect_param = READ_U8(offset + j + 4);
					j += 5;
				}
			}
		}

		offset += packed_patterndata_size;
	}

	/* Read instruments */
	for(uint16_t i = 0; i < ctx->module.num_instruments; ++i) {
		xm_instrument_t* instr = mod->instruments + i;

		/* Original FT2 would load instruments with a direct read into the
		   instrument data structure that was previously zeroed. This means
		   that if the declared length was less than INSTRUMENT_HEADER_LENGTH,
		   all excess data would be zeroed. This is used by the XM compressor
		   BoobieSqueezer. To implement this, bound all reads to the header size. */
		uint32_t ins_header_size = READ_U32(offset);
		if (ins_header_size == 0 || ins_header_size > INSTRUMENT_HEADER_LENGTH)
			ins_header_size = INSTRUMENT_HEADER_LENGTH;

#if XM_STRINGS
		READ_MEMCPY_BOUND(instr->name, offset + 4, INSTRUMENT_NAME_LENGTH, offset + ins_header_size);
		instr->name[INSTRUMENT_NAME_LENGTH] = 0;
#endif
	    instr->num_samples = READ_U16_BOUND(offset + 27, offset + ins_header_size);

		if(instr->num_samples > 0) {
			/* Read extra header properties */
			READ_MEMCPY_BOUND(instr->sample_of_notes, offset + 33, NUM_NOTES, offset + ins_header_size);

			instr->volume_envelope.num_points = READ_U8_BOUND(offset + 225, offset + ins_header_size);
			if (instr->volume_envelope.num_points > NUM_ENVELOPE_POINTS)
				instr->volume_envelope.num_points = NUM_ENVELOPE_POINTS;

			instr->panning_envelope.num_points = READ_U8_BOUND(offset + 226, offset + ins_header_size);
			if (instr->panning_envelope.num_points > NUM_ENVELOPE_POINTS)
				instr->panning_envelope.num_points = NUM_ENVELOPE_POINTS;

			for(uint8_t j = 0; j < instr->volume_envelope.num_points; ++j) {
				instr->volume_envelope.points[j].frame = READ_U16_BOUND(offset + 129 + 4 * j, offset + ins_header_size);
				instr->volume_envelope.points[j].value = READ_U16_BOUND(offset + 129 + 4 * j + 2, offset + ins_header_size);
			}

			for(uint8_t j = 0; j < instr->panning_envelope.num_points; ++j) {
				instr->panning_envelope.points[j].frame = READ_U16_BOUND(offset + 177 + 4 * j, offset + ins_header_size);
				instr->panning_envelope.points[j].value = READ_U16_BOUND(offset + 177 + 4 * j + 2, offset + ins_header_size);
			}

			instr->volume_envelope.sustain_point = READ_U8_BOUND(offset + 227, offset + ins_header_size);
			instr->volume_envelope.loop_start_point = READ_U8_BOUND(offset + 228, offset + ins_header_size);
			instr->volume_envelope.loop_end_point = READ_U8_BOUND(offset + 229, offset + ins_header_size);

			instr->panning_envelope.sustain_point = READ_U8_BOUND(offset + 230, offset + ins_header_size);
			instr->panning_envelope.loop_start_point = READ_U8_BOUND(offset + 231, offset + ins_header_size);
			instr->panning_envelope.loop_end_point = READ_U8_BOUND(offset + 232, offset + ins_header_size);

			// Fix broken modules with loop points outside of defined points
			if (instr->volume_envelope.num_points > 0) {
				instr->volume_envelope.loop_start_point =
					MIN(instr->volume_envelope.loop_start_point, instr->volume_envelope.num_points-1);
				instr->volume_envelope.loop_end_point =
					MIN(instr->volume_envelope.loop_end_point,   instr->volume_envelope.num_points-1);
			}
			if (instr->panning_envelope.num_points > 0) {
				instr->panning_envelope.loop_start_point =
					MIN(instr->panning_envelope.loop_start_point, instr->panning_envelope.num_points-1);
				instr->panning_envelope.loop_end_point =
					MIN(instr->panning_envelope.loop_end_point,   instr->panning_envelope.num_points-1);
			}

			uint8_t flags = READ_U8_BOUND(offset + 233, offset + ins_header_size);
			instr->volume_envelope.enabled = flags & (1 << 0);
			instr->volume_envelope.sustain_enabled = flags & (1 << 1);
			instr->volume_envelope.loop_enabled = flags & (1 << 2);

			flags = READ_U8_BOUND(offset + 234, offset + ins_header_size);
			instr->panning_envelope.enabled = flags & (1 << 0);
			instr->panning_envelope.sustain_enabled = flags & (1 << 1);
			instr->panning_envelope.loop_enabled = flags & (1 << 2);

			instr->vibrato_type = READ_U8_BOUND(offset + 235, offset + ins_header_size);
			if(instr->vibrato_type == 2) {
				instr->vibrato_type = 1;
			} else if(instr->vibrato_type == 1) {
				instr->vibrato_type = 2;
			}
			instr->vibrato_sweep = READ_U8_BOUND(offset + 236, offset + ins_header_size);
			instr->vibrato_depth = READ_U8_BOUND(offset + 237, offset + ins_header_size);
			instr->vibrato_rate = READ_U8_BOUND(offset + 238, offset + ins_header_size);
			instr->volume_fadeout = READ_U16_BOUND(offset + 239, offset + ins_header_size);

			instr->samples = (xm_sample_t*)mempool;
			mempool += instr->num_samples * sizeof(xm_sample_t);
		} else {
			instr->samples = NULL;
		}

		/* Instrument header size */
		offset += ins_header_size;

		for(uint16_t j = 0; j < instr->num_samples; ++j) {
			/* Read sample header */
			xm_sample_t* sample = instr->samples + j;

			sample->length = READ_U32(offset);
			sample->loop_start = READ_U32(offset + 4);
			sample->loop_length = READ_U32(offset + 8);
			sample->loop_end = sample->loop_start + sample->loop_length;
			sample->volume = (float)READ_U8(offset + 12) / (float)0x40;
			sample->finetune = (int8_t)READ_U8(offset + 13);

			/* Fix invalid loop definitions */
			if (sample->loop_start > sample->length)
				sample->loop_start = sample->length;
			if (sample->loop_end > sample->length)
				sample->loop_end = sample->length;
			sample->loop_length = sample->loop_end - sample->loop_start;

			uint8_t flags = READ_U8(offset + 14);
			if((flags & 3) == 0 || sample->loop_length == 0) {
				sample->loop_type = XM_NO_LOOP;
			} else if((flags & 3) == 1) {
				sample->loop_type = XM_FORWARD_LOOP;
			} else {
				sample->loop_type = XM_PING_PONG_LOOP;
			}

			sample->bits = (flags & (1 << 4)) ? 16 : 8;

			sample->panning = (float)READ_U8(offset + 15) / (float)0xFF;
			sample->relative_note = (int8_t)READ_U8(offset + 16);
#if XM_STRINGS
			READ_MEMCPY(sample->name, offset + 18, SAMPLE_NAME_LENGTH);
			sample->name[SAMPLE_NAME_LENGTH] = 0;
#endif
			sample->data8 = (int8_t*)mempool;
			mempool += sample->length;

			if(sample->bits == 16) {
				sample->loop_start >>= 1;
				sample->loop_length >>= 1;
				sample->loop_end >>= 1;
				sample->length >>= 1;
			}

			/* Notice that, even if there's a "sample header size" in the
			   instrument header, that value seems ignored, and might even
			   be wrong in some corrupted modules. */
			offset += 40;
		}

		for(uint16_t j = 0; j < instr->num_samples; ++j) {
			/* Read sample data */
			xm_sample_t* sample = instr->samples + j;
			uint32_t length = sample->length;

			if(sample->bits == 16) {
				int16_t v = 0;
				for(uint32_t k = 0; k < length; ++k) {
					v = v + (int16_t)READ_U16(offset + (k << 1));
					sample->data16[k] = v;
				}
				offset += sample->length << 1;
			} else {
				int8_t v = 0;
				for(uint32_t k = 0; k < length; ++k) {
					v = v + (int8_t)READ_U8(offset + k);
					sample->data8[k] = v;
				}
				offset += sample->length;
			}
		}
	}

	return mempool;
}